

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operators.hpp
# Opt level: O3

void chaiscript::bootstrap::operators::
     assign<std::__cxx11::list<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
               (Module *m)

{
  undefined1 local_41;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  dispatch::detail::
  make_callable_impl<chaiscript::bootstrap::operators::assign<std::__cxx11::list<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>(chaiscript::Module&)::_lambda(std::__cxx11::list<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,std::__cxx11::list<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&)_1_,false,false,false,true,std::__cxx11::list<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,std::__cxx11::list<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,std::__cxx11::list<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&>
            (&local_40,&local_41);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"=","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&m->m_funcs,&local_40,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_40.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void assign(Module &m) {
    m.add(chaiscript::fun([](T &lhs, const T &rhs) -> T & { return lhs = rhs; }), "=");
  }